

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

Matrix3d *
RigidBodyDynamics::CalcBodyWorldOrientation
          (Model *model,VectorNd *Q,uint body_id,bool update_kinematics)

{
  uint uVar1;
  reference pvVar2;
  SpatialTransform *this;
  uint in_ECX;
  long in_RSI;
  Matrix3d *in_RDI;
  byte in_R8B;
  SpatialTransform *in_stack_00000020;
  SpatialTransform *in_stack_00000028;
  uint fbody_id;
  VectorNd *in_stack_000003c8;
  VectorNd *in_stack_000003d0;
  VectorNd *in_stack_000003d8;
  Model *in_stack_000003e0;
  Matrix3_t *in_stack_ffffffffffffff58;
  Matrix3_t *in_stack_ffffffffffffff60;
  SpatialTransform *this_00;
  
  if ((in_R8B & 1) != 0) {
    UpdateKinematicsCustom(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8);
  }
  if (in_ECX < *(uint *)(in_RSI + 0x330)) {
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)(in_RSI + 0x300),(ulong)in_ECX);
    Matrix3_t::Matrix3_t(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    uVar1 = in_ECX - *(int *)(in_RSI + 0x330);
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI + 0x318),(ulong)uVar1);
    this_00 = &pvVar2->mParentTransform;
    this = (SpatialTransform *)(in_RSI + 0x300);
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI + 0x318),(ulong)uVar1);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  *)this,(ulong)pvVar2->mMovableParent);
    Math::SpatialTransform::operator*(in_stack_00000028,in_stack_00000020);
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RSI + 0x318),(ulong)uVar1);
    Math::SpatialTransform::operator=(this_00,this);
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RSI + 0x318),(ulong)uVar1);
    Matrix3_t::Matrix3_t(&this_00->E,&this->E);
  }
  return in_RDI;
}

Assistant:

RBDL_DLLAPI Matrix3d CalcBodyWorldOrientation(
    Model &model,
    const VectorNd &Q,
    const unsigned int body_id,
    bool update_kinematics) {
  // update the Kinematics if necessary
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  if (body_id >= model.fixed_body_discriminator) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    model.mFixedBodies[fbody_id].mBaseTransform = 
      model.mFixedBodies[fbody_id].mParentTransform 
      * model.X_base[model.mFixedBodies[fbody_id].mMovableParent];

    return model.mFixedBodies[fbody_id].mBaseTransform.E;
  }

  return model.X_base[body_id].E;
}